

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

VectorNd __thiscall HermiteSpline<3U,_1U>::interpolate(HermiteSpline<3U,_1U> *this,double s)

{
  double dVar1;
  UnitBoundedPolynomial1<3U> *this_00;
  VectorNd *p;
  undefined8 *in_RSI;
  VectorNd VVar2;
  double dVar3;
  
  this_00 = (UnitBoundedPolynomial1<3U> *)*in_RSI;
  dVar1 = this_00[1].coeffs[0];
  while ((dVar1 < s && ((UnitBoundedPolynomial1<3U> *)in_RSI[1] != this_00))) {
    s = s - dVar1;
  }
  dVar3 = 1.0;
  if (s <= 1.0) {
    dVar3 = s;
  }
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       UnitBoundedPolynomial1<3U>::interpolate(this_00,dVar3 / dVar1);
  (this->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
                array[0];
  return (VectorNd)
         VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
         [0];
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}